

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_1_dq_string_inner(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  (G->data).line_number = (G->data).line_number + 1;
  pPVar1 = PVIP_node_append_string(&G->data,(G->data).literal_str,"\n",1);
  (G->data).literal_str = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_dq_string_inner(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define v G->val[-1]
#define k G->val[-2]
#define h G->val[-3]
#define e G->val[-4]
  yyprintf((stderr, "do yy_1_dq_string_inner"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {G->data.line_number++; APPEND_S(\"\\n\", 1); }\n"));
  G->data.line_number++; APPEND_S("\n", 1); ;
#undef v
#undef k
#undef h
#undef e
}